

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

int order_select(sat_solver3 *s,float random_var_freq)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  double dVar6;
  int local_48;
  int local_44;
  int child;
  int i;
  int x;
  int size;
  int next_1;
  int next;
  int *orderpos;
  int *heap;
  float random_var_freq_local;
  sat_solver3 *s_local;
  
  piVar5 = veci_begin(&s->order);
  piVar1 = s->orderpos;
  dVar6 = drand(&s->random_seed);
  if (dVar6 < (double)random_var_freq) {
    iVar2 = irand(&s->random_seed,s->size);
    if ((iVar2 < 0) || (s->size <= iVar2)) {
      __assert_fail("next >= 0 && next < s->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                    ,0xb4,"int order_select(sat_solver3 *, float)");
    }
    iVar3 = var_value(s,iVar2);
    if (iVar3 == 3) {
      return iVar2;
    }
  }
  do {
    iVar2 = veci_size(&s->order);
    if (iVar2 < 1) {
      return -1;
    }
    iVar2 = *piVar5;
    iVar4 = veci_size(&s->order);
    iVar4 = iVar4 + -1;
    iVar3 = piVar5[iVar4];
    veci_resize(&s->order,iVar4);
    piVar1[iVar2] = -1;
    if (0 < iVar4) {
      local_44 = 0;
      for (local_48 = 1; local_48 < iVar4; local_48 = local_48 * 2 + 1) {
        if ((local_48 + 1 < iVar4) &&
           (s->activity[piVar5[local_48]] < s->activity[piVar5[local_48 + 1]])) {
          local_48 = local_48 + 1;
        }
        if (iVar4 <= local_48) {
          __assert_fail("child < size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                        ,0xc6,"int order_select(sat_solver3 *, float)");
        }
        if (s->activity[piVar5[local_48]] <= s->activity[iVar3]) break;
        piVar5[local_44] = piVar5[local_48];
        piVar1[piVar5[local_44]] = local_44;
        local_44 = local_48;
      }
      piVar5[local_44] = iVar3;
      piVar1[piVar5[local_44]] = local_44;
    }
    iVar3 = var_value(s,iVar2);
    if (iVar3 == 3) {
      return iVar2;
    }
  } while( true );
}

Assistant:

static inline int  order_select(sat_solver2* s, float random_var_freq) // selectvar
{
    int*      heap     = veci_begin(&s->order);
    int*      orderpos = s->orderpos;
    // Random decision:
    if (drand(&s->random_seed) < random_var_freq){
        int next = irand(&s->random_seed,s->size);
        assert(next >= 0 && next < s->size);
        if (var_value(s, next) == varX)
            return next;
    }
    // Activity based decision:
    while (veci_size(&s->order) > 0){
        int    next  = heap[0];
        int    size  = veci_size(&s->order)-1;
        int    x     = heap[size];
        veci_resize(&s->order,size);
        orderpos[next] = -1;
        if (size > 0){
            unsigned act   = s->activity[x];
            int      i     = 0;
            int      child = 1;
            while (child < size){
                if (child+1 < size && s->activity[heap[child]] < s->activity[heap[child+1]])
                    child++;
                assert(child < size);
                if (act >= s->activity[heap[child]])
                    break;
                heap[i]           = heap[child];
                orderpos[heap[i]] = i;
                i                 = child;
                child             = 2 * child + 1;
            }
            heap[i]           = x;
            orderpos[heap[i]] = i;
        }
        if (var_value(s, next) == varX)
            return next;
    }
    return var_Undef;
}